

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

void __thiscall YAML::Emitter::BlockMapPrepareLongKey(Emitter *this,value child)

{
  ostream_wrapper *this_00;
  ulong uVar1;
  _Head_base<0UL,_YAML::EmitterState_*,_false> _Var2;
  size_t sVar3;
  _Head_base<0UL,_YAML::EmitterState_*,_false> _Var4;
  undefined1 local_29;
  
  _Var4._M_head_impl =
       (this->m_pState)._M_t.
       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
       super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
  uVar1 = (_Var4._M_head_impl)->m_curIndent;
  sVar3 = EmitterState::CurGroupChildCount(_Var4._M_head_impl);
  if (child != NoType) {
    _Var4._M_head_impl =
         (this->m_pState)._M_t.
         super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
         super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
         super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
    if (((_Var4._M_head_impl)->m_hasAnchor == false) && (((_Var4._M_head_impl)->m_hasTag & 1U) == 0)
       ) {
      if (sVar3 != 0) {
        ostream_wrapper::write(&this->m_stream,0x75cfd2,(void *)0x1,(size_t)_Var4._M_head_impl);
      }
      this_00 = &this->m_stream;
      if ((this->m_stream).m_comment == true) {
        ostream_wrapper::write(this_00,0x75cfd2,(void *)0x1,(size_t)_Var4._M_head_impl);
      }
      if ((this->m_stream).m_col < uVar1) {
        do {
          local_29 = 0x20;
          ostream_wrapper::write(this_00,(int)&local_29,(void *)0x1,(size_t)_Var4._M_head_impl);
        } while ((this->m_stream).m_col < uVar1);
      }
      ostream_wrapper::write(this_00,0x75b075,(void *)0x1,(size_t)_Var4._M_head_impl);
    }
    if (child < (BlockMap|Property)) {
      if ((0x2eU >> (child & 0x1f) & 1) == 0) {
        if (((0x50U >> (child & 0x1f) & 1) != 0) &&
           ((_Var2._M_head_impl =
                  (this->m_pState)._M_t.
                  super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                  .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,
            (_Var2._M_head_impl)->m_hasAnchor != false ||
            (((_Var2._M_head_impl)->m_hasTag & 1U) != 0)))) {
          ostream_wrapper::write(&this->m_stream,0x75cfd2,(void *)0x1,(size_t)_Var4._M_head_impl);
        }
      }
      else {
        SpaceOrIndentTo(this,true,uVar1 + 1);
      }
    }
  }
  return;
}

Assistant:

void Emitter::BlockMapPrepareLongKey(EmitterNodeType::value child) {
  const std::size_t curIndent = m_pState->CurIndent();
  const std::size_t childCount = m_pState->CurGroupChildCount();

  if (child == EmitterNodeType::NoType)
    return;

  if (!m_pState->HasBegunContent()) {
    if (childCount > 0) {
      m_stream << "\n";
    }
    if (m_stream.comment()) {
      m_stream << "\n";
    }
    m_stream << IndentTo(curIndent);
    m_stream << "?";
  }

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      SpaceOrIndentTo(true, curIndent + 1);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      if (m_pState->HasBegunContent())
        m_stream << "\n";
      break;
  }
}